

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

uint clock_ticks(void)

{
  uint ticks;
  long msec;
  time_t sec;
  timespec gettime;
  
  clock_gettime(1,(timespec *)&sec);
  return (int)sec * 1000 + (int)(gettime.tv_sec / 1000000);
}

Assistant:

static unsigned int clock_ticks()
{
#ifdef WIN32
#ifdef TIMER_GETTICKCOUNT
	unsigned int ticks = GetTickCount();
#else // TIMER_GETTICKCOUNT
	unsigned int ticks = timeGetTime();
#endif // TIMER_GETTICKCOUNT
#else // WIN32
#ifdef CLOCK_MONOTONIC
	struct timespec gettime;
	clock_gettime(CLOCK_MONOTONIC, &gettime);
	std::time_t sec = gettime.tv_sec;
	long msec = gettime.tv_nsec / 1000000;
#else // CLOCK_MONOTONIC
	struct timeval gettime;
	gettimeofday(&gettime, 0);
	std::time_t sec = gettime.tv_sec;
	long msec = gettime.tv_usec / 1000;
#endif // CLOCK_MONOTONIC
	unsigned int ticks = static_cast<unsigned int>(sec * 1000 + msec);
#endif // WIN32

	return ticks;
}